

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaffeConverterLib.cpp
# Opt level: O0

void convertCaffe(string *srcPath,string *dstPath,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *meanImageProtoPath,
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *imageInputs,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *isBGR,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                        *redBias,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *blueBias,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *greenBias,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *grayBias,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *scale,string *caffeProtoTxtPath,string *classLabelPath,
                 string *predictedFeatureName)

{
  bool bVar1;
  char *pcVar2;
  runtime_error *prVar3;
  string *psVar4;
  undefined1 local_610 [8];
  Result r;
  Model modelSpec;
  string local_5b0 [32];
  stringstream local_590 [8];
  stringstream ss_1;
  ostream local_580 [376];
  undefined1 local_408 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
  caffeMeanImageBlob;
  NetParameter caffeWeightsNetwork;
  NetParameter caffeNetwork;
  string local_290 [32];
  stringstream local_270 [8];
  stringstream ss;
  ostream local_260 [380];
  int local_e4;
  undefined1 local_e0 [4];
  int statResult;
  stat buf;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *redBias_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *isBGR_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *imageInputs_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *meanImageProtoPath_local;
  string *dstPath_local;
  string *srcPath_local;
  
  bVar1 = std::operator==(srcPath,"");
  if (bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Required source model path --srcModelPath\n");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::operator==(dstPath,"");
  if (bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Required destination model path --dstModelPath\n");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_e4 = stat(pcVar2,(stat *)local_e0);
  if (local_e4 != 0) {
    std::__cxx11::stringstream::stringstream(local_270);
    std::operator<<(local_260,"Unable to open caffe model provided in the source model path: ");
    std::operator<<(local_260,(string *)srcPath);
    std::ostream::operator<<(local_260,std::endl<char,std::char_traits<char>>);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar3,local_290);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  caffe::NetParameter::NetParameter((NetParameter *)&caffeWeightsNetwork.force_backward_);
  caffe::NetParameter::NetParameter
            ((NetParameter *)&caffeMeanImageBlob._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
         *)local_408);
  bVar1 = std::operator!=(caffeProtoTxtPath,"");
  if (bVar1) {
    CoreMLConverter::loadCaffeNetwork
              (srcPath,(NetParameter *)
                       &caffeMeanImageBlob._M_t._M_impl.super__Rb_tree_header._M_node_count,
               caffeProtoTxtPath,(NetParameter *)&caffeWeightsNetwork.force_backward_,
               meanImageProtoPath,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
                *)local_408);
  }
  else {
    CoreMLConverter::loadCaffeNetwork
              (srcPath,(NetParameter *)
                       &caffeMeanImageBlob._M_t._M_impl.super__Rb_tree_header._M_node_count,
               caffeProtoTxtPath,(NetParameter *)&caffeWeightsNetwork.force_backward_,
               meanImageProtoPath,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
                *)local_408);
    caffe::NetParameter::operator=
              ((NetParameter *)&caffeWeightsNetwork.force_backward_,
               (NetParameter *)&caffeMeanImageBlob._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
  }
  bVar1 = std::operator!=(classLabelPath,"");
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_e4 = stat(pcVar2,(stat *)local_e0);
    if (local_e4 != 0) {
      std::__cxx11::stringstream::stringstream(local_590);
      std::operator<<(local_580,"Unable to open class label file provided in the path: ");
      std::operator<<(local_580,(string *)classLabelPath);
      std::ostream::operator<<(local_580,std::endl<char,std::char_traits<char>>);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(prVar3,local_5b0);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_e4 = 0;
  }
  CoreML::Specification::Model::Model((Model *)((long)&r.m_message.field_2 + 8));
  CoreMLConverter::convertCaffeNetwork
            ((NetParameter *)&caffeMeanImageBlob._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (NetParameter *)&caffeWeightsNetwork.force_backward_,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
              *)local_408,(Model *)((long)&r.m_message.field_2 + 8),isBGR,redBias,blueBias,greenBias
             ,grayBias,scale,imageInputs,classLabelPath,predictedFeatureName);
  CoreML::saveSpecificationPath
            ((Result *)local_610,(Model *)((long)&r.m_message.field_2 + 8),dstPath);
  bVar1 = CoreML::Result::good((Result *)local_610);
  if (bVar1) {
    CoreML::Result::~Result((Result *)local_610);
    CoreML::Specification::Model::~Model((Model *)((long)&r.m_message.field_2 + 8));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
            *)local_408);
    caffe::NetParameter::~NetParameter
              ((NetParameter *)&caffeMeanImageBlob._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    caffe::NetParameter::~NetParameter((NetParameter *)&caffeWeightsNetwork.force_backward_);
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  psVar4 = CoreML::Result::message_abi_cxx11_((Result *)local_610);
  std::runtime_error::runtime_error(prVar3,(string *)psVar4);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void convertCaffe(const std::string& srcPath,
                  const std::string& dstPath,
                  const std::map<std::string, std::string>& meanImageProtoPath,
                  const std::set<std::string>& imageInputs,
                  const std::map<std::string, bool>& isBGR,
                  const std::map<std::string, double>& redBias,
                  const std::map<std::string, double>& blueBias,
                  const std::map<std::string, double>& greenBias,
                  const std::map<std::string, double>& grayBias,
                  const std::map<std::string, double>& scale,
                  const std::string& caffeProtoTxtPath,
                  const std::string& classLabelPath,
                  const std::string& predictedFeatureName) {

    if (srcPath == "") {
        throw std::runtime_error("Required source model path --srcModelPath\n");
    }
    
    if (dstPath == "") {
        throw std::runtime_error("Required destination model path --dstModelPath\n");
    }

    struct stat buf;
    int statResult = stat(srcPath.c_str(), &buf);
    if (statResult != 0) {
        std::stringstream ss;
        ss << "Unable to open caffe model provided in the source model path: ";
        ss << srcPath;
        ss << std::endl;
        throw std::runtime_error(ss.str());
    }
    
    // Load the caffe network
    caffe::NetParameter caffeNetwork;
    caffe::NetParameter caffeWeightsNetwork;
    std::map<std::string, caffe::BlobProto> caffeMeanImageBlob;
    
    // TODO: We need to use only one caffe network proto variable
    // This is a workaround for that.
    if (caffeProtoTxtPath != "") {
        CoreMLConverter::loadCaffeNetwork(srcPath, caffeWeightsNetwork, caffeProtoTxtPath, caffeNetwork, meanImageProtoPath, caffeMeanImageBlob);
    
    } else {
        CoreMLConverter::loadCaffeNetwork(srcPath, caffeWeightsNetwork, caffeProtoTxtPath, caffeNetwork, meanImageProtoPath, caffeMeanImageBlob);
        caffeNetwork = caffeWeightsNetwork;
    }
    
    if (classLabelPath != "") {
	statResult = stat(classLabelPath.c_str(), &buf);
        if (statResult != 0) {
            std::stringstream ss;
            ss << "Unable to open class label file provided in the path: ";
            ss << classLabelPath;
            ss << std::endl;
            throw std::runtime_error(ss.str());
        }
    }
    
    // Convert the caffe network
    Specification::Model modelSpec;
    CoreMLConverter::convertCaffeNetwork(caffeWeightsNetwork, caffeNetwork, caffeMeanImageBlob, modelSpec,
                    isBGR, redBias, blueBias, greenBias, grayBias, scale, imageInputs, classLabelPath,
                    predictedFeatureName);
    
    // Save the format to the model path.
    Result r = saveSpecificationPath(modelSpec, dstPath);
    if (!r.good()) {
        throw std::runtime_error(r.message());
    }
}